

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void tcg_gen_gvec_2s_sparc64
               (TCGContext_conflict8 *tcg_ctx,uint32_t dofs,uint32_t aofs,uint32_t oprsz,
               uint32_t maxsz,TCGv_i64 c,GVecGen2s_conflict8 *g)

{
  _Bool _Var1;
  uint oprsz_00;
  TCGOpcode *n;
  TCGv_vec r;
  TCGv_i64 out;
  TCGv_i32 ret;
  TCGOpcode *local_68;
  TCGv_i32 t32;
  TCGv_i64 t64;
  uint32_t some;
  TCGv_vec t_vec;
  TCGOpcode *hold_list;
  TCGOpcode *this_list;
  TCGType type;
  TCGv_i64 c_local;
  uint32_t maxsz_local;
  uint32_t oprsz_local;
  uint32_t aofs_local;
  uint32_t dofs_local;
  TCGContext_conflict8 *tcg_ctx_local;
  
  check_size_align(oprsz,maxsz,dofs | aofs);
  check_overlap_2(dofs,aofs,maxsz);
  this_list._4_4_ = TCG_TYPE_I32;
  if (g->fniv != (_func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_TCGv_vec_conflict8 *)0x0) {
    this_list._4_4_ =
         choose_vector_type(tcg_ctx,g->opt_opc,(uint)g->vece,oprsz,(_Bool)(g->prefer_i64 & 1));
  }
  c_local._0_4_ = maxsz;
  c_local._4_4_ = oprsz;
  oprsz_local = dofs;
  if (this_list._4_4_ == TCG_TYPE_I32) {
    if ((g->fni8 == (_func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_TCGv_i64_conflict8 *)0x0) ||
       (_Var1 = check_size_impl(oprsz,8), !_Var1)) {
      if ((g->fni4 == (_func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_TCGv_i32_conflict8 *)0x0) ||
         (_Var1 = check_size_impl(oprsz,4), !_Var1)) {
        tcg_gen_gvec_2i_ool_sparc64(tcg_ctx,dofs,aofs,c,oprsz,maxsz,0,g->fno);
        return;
      }
      ret = tcg_temp_new_i32(tcg_ctx);
      tcg_gen_extrl_i64_i32_sparc64(tcg_ctx,ret,c);
      gen_dup_i32(tcg_ctx,(uint)g->vece,ret,ret);
      expand_2s_i32(tcg_ctx,dofs,aofs,oprsz,ret,(_Bool)(g->scalar_first & 1),g->fni4);
      tcg_temp_free_i32(tcg_ctx,ret);
    }
    else {
      out = tcg_temp_new_i64(tcg_ctx);
      gen_dup_i64(tcg_ctx,(uint)g->vece,out,c);
      expand_2s_i64(tcg_ctx,dofs,aofs,oprsz,out,(_Bool)(g->scalar_first & 1),g->fni8);
      tcg_temp_free_i64(tcg_ctx,out);
    }
    goto LAB_00e7825f;
  }
  if (g->opt_opc == (TCGOpcode *)0x0) {
    local_68 = (TCGOpcode *)0x0;
  }
  else {
    local_68 = g->opt_opc;
  }
  n = tcg_swap_vecop_list(local_68);
  r = tcg_temp_new_vec_sparc64(tcg_ctx,this_list._4_4_);
  tcg_gen_dup_i64_vec_sparc64(tcg_ctx,(uint)g->vece,r,c);
  if (this_list._4_4_ == TCG_TYPE_V64) {
    expand_2s_vec(tcg_ctx,(uint)g->vece,dofs,aofs,oprsz,8,TCG_TYPE_V64,r,
                  (_Bool)(g->scalar_first & 1),g->fniv);
  }
  else {
    maxsz_local = aofs;
    if (this_list._4_4_ != TCG_TYPE_V128) {
      if (this_list._4_4_ != TCG_TYPE_V256) {
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                   ,0x4b7,(char *)0x0);
      }
      oprsz_00 = oprsz & 0xffffffe0;
      expand_2s_vec(tcg_ctx,(uint)g->vece,dofs,aofs,oprsz_00,0x20,TCG_TYPE_V256,r,
                    (_Bool)(g->scalar_first & 1),g->fniv);
      if (oprsz_00 == oprsz) goto LAB_00e780ec;
      oprsz_local = oprsz_00 + dofs;
      maxsz_local = oprsz_00 + aofs;
      c_local._4_4_ = oprsz - oprsz_00;
      c_local._0_4_ = maxsz - oprsz_00;
    }
    expand_2s_vec(tcg_ctx,(uint)g->vece,oprsz_local,maxsz_local,c_local._4_4_,0x10,TCG_TYPE_V128,r,
                  (_Bool)(g->scalar_first & 1),g->fniv);
  }
LAB_00e780ec:
  tcg_temp_free_vec(tcg_ctx,r);
  tcg_swap_vecop_list(n);
LAB_00e7825f:
  if (c_local._4_4_ < (uint32_t)c_local) {
    expand_clr(tcg_ctx,oprsz_local + c_local._4_4_,(uint32_t)c_local - c_local._4_4_);
  }
  return;
}

Assistant:

void tcg_gen_gvec_2s(TCGContext *tcg_ctx, uint32_t dofs, uint32_t aofs, uint32_t oprsz,
                     uint32_t maxsz, TCGv_i64 c, const GVecGen2s *g)
{
    TCGType type;

    check_size_align(oprsz, maxsz, dofs | aofs);
    check_overlap_2(dofs, aofs, maxsz);

    type = 0;
    if (g->fniv) {
        type = choose_vector_type(tcg_ctx, g->opt_opc, g->vece, oprsz, g->prefer_i64);
    }
    if (type != 0) {
        const TCGOpcode *this_list = g->opt_opc ? g->opt_opc : vecop_list_empty;
        const TCGOpcode *hold_list = tcg_swap_vecop_list(this_list);
        TCGv_vec t_vec = tcg_temp_new_vec(tcg_ctx, type);
        uint32_t some;

        tcg_gen_dup_i64_vec(tcg_ctx, g->vece, t_vec, c);

        switch (type) {
        case TCG_TYPE_V256:
            /* Recall that ARM SVE allows vector sizes that are not a
             * power of 2, but always a multiple of 16.  The intent is
             * that e.g. size == 80 would be expanded with 2x32 + 1x16.
             */
            some = QEMU_ALIGN_DOWN(oprsz, 32);
            expand_2s_vec(tcg_ctx, g->vece, dofs, aofs, some, 32, TCG_TYPE_V256,
                          t_vec, g->scalar_first, g->fniv);
            if (some == oprsz) {
                break;
            }
            dofs += some;
            aofs += some;
            oprsz -= some;
            maxsz -= some;
            /* fallthru */

        case TCG_TYPE_V128:
            expand_2s_vec(tcg_ctx, g->vece, dofs, aofs, oprsz, 16, TCG_TYPE_V128,
                          t_vec, g->scalar_first, g->fniv);
            break;

        case TCG_TYPE_V64:
            expand_2s_vec(tcg_ctx, g->vece, dofs, aofs, oprsz, 8, TCG_TYPE_V64,
                          t_vec, g->scalar_first, g->fniv);
            break;

        default:
            g_assert_not_reached();
        }
        tcg_temp_free_vec(tcg_ctx, t_vec);
        tcg_swap_vecop_list(hold_list);
    } else if (g->fni8 && check_size_impl(oprsz, 8)) {
        TCGv_i64 t64 = tcg_temp_new_i64(tcg_ctx);

        gen_dup_i64(tcg_ctx, g->vece, t64, c);
        expand_2s_i64(tcg_ctx, dofs, aofs, oprsz, t64, g->scalar_first, g->fni8);
        tcg_temp_free_i64(tcg_ctx, t64);
    } else if (g->fni4 && check_size_impl(oprsz, 4)) {
        TCGv_i32 t32 = tcg_temp_new_i32(tcg_ctx);

        tcg_gen_extrl_i64_i32(tcg_ctx, t32, c);
        gen_dup_i32(tcg_ctx, g->vece, t32, t32);
        expand_2s_i32(tcg_ctx, dofs, aofs, oprsz, t32, g->scalar_first, g->fni4);
        tcg_temp_free_i32(tcg_ctx, t32);
    } else {
        tcg_gen_gvec_2i_ool(tcg_ctx, dofs, aofs, c, oprsz, maxsz, 0, g->fno);
        return;
    }

    if (oprsz < maxsz) {
        expand_clr(tcg_ctx, dofs + oprsz, maxsz - oprsz);
    }
}